

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void computeHMS(DateTime *p)

{
  int iVar1;
  long *in_RDI;
  DateTime *unaff_retaddr;
  int s;
  
  if (*(char *)((long)in_RDI + 0x2b) == '\0') {
    computeJD(unaff_retaddr);
    in_RDI[4] = (long)((double)(int)((*in_RDI + 43200000) % 86400000) / 1000.0);
    iVar1 = (int)(double)in_RDI[4];
    in_RDI[4] = (long)((double)in_RDI[4] - (double)iVar1);
    *(int *)((long)in_RDI + 0x14) = iVar1 / 0xe10;
    iVar1 = iVar1 + *(int *)((long)in_RDI + 0x14) * -0xe10;
    *(int *)(in_RDI + 3) = iVar1 / 0x3c;
    in_RDI[4] = (long)((double)(iVar1 + (int)in_RDI[3] * -0x3c) + (double)in_RDI[4]);
    *(undefined1 *)((long)in_RDI + 0x29) = 0;
    *(undefined1 *)((long)in_RDI + 0x2b) = 1;
  }
  return;
}

Assistant:

static void computeHMS(DateTime *p){
  int s;
  if( p->validHMS ) return;
  computeJD(p);
  s = (int)((p->iJD + 43200000) % 86400000);
  p->s = s/1000.0;
  s = (int)p->s;
  p->s -= s;
  p->h = s/3600;
  s -= p->h*3600;
  p->m = s/60;
  p->s += s - p->m*60;
  p->rawS = 0;
  p->validHMS = 1;
}